

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O3

string * __thiscall position::to_fen_abi_cxx11_(string *__return_storage_ptr__,position *this)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char __c;
  byte bVar3;
  Piece PVar4;
  Square SVar5;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  Piece PVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  char *__s;
  ulong uVar16;
  int c;
  long lVar17;
  uint uVar18;
  uint uVar19;
  size_type __n;
  string c_str;
  string mv50;
  string half_mvs;
  string ep_sq;
  int r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  lVar13 = 7;
  do {
    lVar17 = 0;
    uVar14 = 0;
    local_58 = lVar13;
    do {
      while (uVar18 = uVar14, lVar1 = lVar17 + lVar13 * 8,
            (this->pcs).piece_on._M_elems[lVar1] != no_piece) {
        if (0 < (int)uVar18) {
          uVar14 = 1;
          if (9 < uVar18) {
            uVar19 = 4;
            uVar8 = uVar18;
            do {
              uVar14 = uVar19;
              if (uVar8 < 100) {
                uVar14 = uVar14 - 2;
                goto LAB_0011ffd9;
              }
              if (uVar8 < 1000) {
                uVar14 = uVar14 - 1;
                goto LAB_0011ffd9;
              }
              if (uVar8 < 10000) goto LAB_0011ffd9;
              bVar6 = 99999 < uVar8;
              uVar19 = uVar14 + 4;
              uVar8 = uVar8 / 10000;
            } while (bVar6);
            uVar14 = uVar14 + 1;
          }
LAB_0011ffd9:
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_e0,(ulong)uVar14,'-');
          std::__detail::__to_chars_10_impl<unsigned_int>(local_e0._M_dataplus._M_p,uVar14,uVar18);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (__return_storage_ptr__,local_e0._M_dataplus._M_p,local_e0._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
        }
        PVar4 = (this->pcs).piece_on._M_elems[lVar1];
        PVar11 = PVar4 + pieces;
        if ((this->pcs).color_on._M_elems[lVar1] != black) {
          PVar11 = PVar4;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,
                   SanPiece.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)PVar11]);
        lVar17 = lVar17 + 1;
        uVar14 = 0;
        if (lVar17 == 8) goto LAB_0012012b;
      }
      uVar14 = uVar18 + 1;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 8);
    if (-1 < (int)uVar18) {
      uVar18 = 1;
      if (9 < uVar14) {
        uVar19 = uVar14;
        uVar8 = 4;
        do {
          uVar18 = uVar8;
          if (uVar19 < 100) {
            uVar18 = uVar18 - 2;
            goto LAB_001200d1;
          }
          if (uVar19 < 1000) {
            uVar18 = uVar18 - 1;
            goto LAB_001200d1;
          }
          if (uVar19 < 10000) goto LAB_001200d1;
          bVar6 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          uVar8 = uVar18 + 4;
        } while (bVar6);
        uVar18 = uVar18 + 1;
      }
LAB_001200d1:
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_e0,(ulong)uVar18,'-');
      std::__detail::__to_chars_10_impl<unsigned_int>(local_e0._M_dataplus._M_p,uVar18,uVar14);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (__return_storage_ptr__,local_e0._M_dataplus._M_p,local_e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
LAB_0012012b:
    lVar13 = local_58 + -1;
    if (local_58 == 0) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"/");
  } while( true );
  __s = " b";
  if ((this->ifo).stm == white) {
    __s = " w";
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,__s);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
  uVar7 = (this->ifo).cmask;
  if ((uVar7 & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_e0,"K");
    uVar7 = (this->ifo).cmask;
  }
  if ((uVar7 & 2) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_e0,"Q");
    uVar7 = (this->ifo).cmask;
  }
  if ((uVar7 & 4) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_e0,"k");
    uVar7 = (this->ifo).cmask;
  }
  if ((uVar7 & 8) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_e0,"q");
  }
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_e0,"");
  if (iVar9 == 0) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78," -","");
  }
  else {
    std::operator+(&local_78," ",&local_e0);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_78._M_dataplus._M_p,local_78._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  SVar5 = (this->ifo).eps;
  if (SVar5 != no_square) {
    uVar18 = ((int)SVar5 >> 3) + 1;
    uVar14 = -uVar18;
    if (0 < (int)uVar18) {
      uVar14 = uVar18;
    }
    uVar19 = 1;
    if (9 < uVar14) {
      uVar16 = (ulong)uVar14;
      uVar8 = 4;
      do {
        uVar19 = uVar8;
        uVar15 = (uint)uVar16;
        if (uVar15 < 100) {
          uVar19 = uVar19 - 2;
          goto LAB_0012031f;
        }
        if (uVar15 < 1000) {
          uVar19 = uVar19 - 1;
          goto LAB_0012031f;
        }
        if (uVar15 < 10000) goto LAB_0012031f;
        uVar16 = uVar16 / 10000;
        uVar8 = uVar19 + 4;
      } while (99999 < uVar15);
      uVar19 = uVar19 + 1;
    }
LAB_0012031f:
    __c = SanCols.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[SVar5 & H1];
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_98,(ulong)(uVar19 + -((int)uVar18 >> 0x1f)),'-');
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_98._M_dataplus._M_p + (uint)-((int)uVar18 >> 0x1f),uVar19,uVar14);
    pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              insert(&local_98,0,1,__c);
    local_b8._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
    paVar12 = &pbVar10->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == paVar12) {
      local_b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
    }
    local_b8._M_string_length = pbVar10->_M_string_length;
    (pbVar10->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar10->_M_string_length = 0;
    (pbVar10->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_78,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  iVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_78,"");
  if (iVar9 == 0) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8," -","");
  }
  else {
    std::operator+(&local_b8," ",&local_78);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  paVar12 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar12) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  bVar3 = (this->ifo).move50;
  __n = 1;
  if (9 < bVar3) {
    __n = (size_type)(3 - (bVar3 < 100));
  }
  local_b8._M_dataplus._M_p = (pointer)paVar12;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_b8,__n,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_b8._M_dataplus._M_p,(uint)__n,(uint)bVar3);
  std::operator+(&local_98," ",&local_b8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_98._M_dataplus._M_p,local_98._M_string_length);
  paVar2 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  uVar7 = (this->ifo).hmvs;
  uVar14 = 1;
  if (((9 < uVar7) && (uVar14 = 2, 99 < uVar7)) && (uVar14 = 3, 999 < uVar7)) {
    uVar14 = 5 - (uVar7 < 10000);
  }
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_98,(ulong)uVar14,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_98._M_dataplus._M_p,uVar14,(uint)uVar7);
  std::operator+(&local_50," ",&local_98);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar12) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string position::to_fen() const {
	std::string fen = "";
	for (int r = 7; r >= 0; --r) {
		int empties = 0;

		for (int c = 0; c < 8; ++c) {
			int s = r * 8 + c;
			if (piece_on(Square(s)) == no_piece) { ++empties; continue; }
			if (empties > 0) fen += std::to_string(empties);
			empties = 0;

			fen += SanPiece[(color_on(Square(s)) == black ?
				piece_on(Square(s)) + 6 : piece_on(Square(s)))];
		}

		if (empties > 0) fen += std::to_string(empties);
		if (r > 0) fen += "/";
	}

	fen += (to_move() == white ? " w" : " b");

	// castle rights
	std::string c_str = "";
	if ((ifo.cmask & wks) == wks) c_str += "K";
	if ((ifo.cmask & wqs) == wqs) c_str += "Q";
	if ((ifo.cmask & bks) == bks) c_str += "k";
	if ((ifo.cmask & bqs) == bqs) c_str += "q";
	fen += (c_str == "" ? " -" : " " + c_str);

	// ep-square
	std::string ep_sq = "";
	if (ifo.eps != no_square) {
		ep_sq += SanCols[util::col(ifo.eps)] + std::to_string(util::row(ifo.eps) + 1);
	}
	fen += (ep_sq == "" ? " -" : " " + ep_sq);

	// move50
	std::string mv50 = std::to_string(ifo.move50);
	fen += " " + mv50;

	// half-mvs
	std::string half_mvs = std::to_string(ifo.hmvs);
	fen += " " + half_mvs;

	return fen;
}